

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

bool __thiscall IR::Instr::HasEmptyArgOutChain(Instr *this,Instr **startCallInstrOut)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  StackSym *this_00;
  
  bVar3 = CanHaveArgOutChain(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xd44,"(CanHaveArgOutChain())","CanHaveArgOutChain()");
    if (!bVar3) goto LAB_00484854;
    *puVar5 = 0;
  }
  bVar3 = Opnd::IsRegOpnd(this->m_src2);
  if (bVar3) {
    pRVar6 = Opnd::AsRegOpnd(this->m_src2);
    this_00 = Sym::AsStackSym(&pRVar6->m_sym->super_Sym);
    bVar4 = StackSym::IsArgSlotSym(this_00);
    if ((bVar4) || ((this_00->field_0x18 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd4a,"(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                         "Arg tree not single def...");
      if (!bVar4) goto LAB_00484854;
      *puVar5 = 0;
    }
    pIVar1 = (this_00->field_5).m_instrDef;
    if (pIVar1->m_opcode != StartCall) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd4c,"(startCallInstr->m_opcode == Js::OpCode::StartCall)",
                         "Problem with arg chain.");
      if (!bVar4) {
LAB_00484854:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    if (startCallInstrOut != (Instr **)0x0) {
      *startCallInstrOut = pIVar1;
    }
  }
  return bVar3;
}

Assistant:

bool Instr::HasEmptyArgOutChain(IR::Instr** startCallInstrOut)
{
    Assert(CanHaveArgOutChain());

    if (GetSrc2()->IsRegOpnd())
    {
        IR::RegOpnd * argLinkOpnd = GetSrc2()->AsRegOpnd();
        StackSym *argLinkSym = argLinkOpnd->m_sym->AsStackSym();
        AssertMsg(!argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
        IR::Instr* startCallInstr = argLinkSym->m_instrDef;
        AssertMsg(startCallInstr->m_opcode == Js::OpCode::StartCall, "Problem with arg chain.");
        if (startCallInstrOut != nullptr)
        {
            *startCallInstrOut = startCallInstr;
        }
        return true;
    }

    return false;
}